

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

double cross_entropy<unsigned_int,unsigned_int>
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  uint uVar1;
  undefined1 auVar2 [16];
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  int iVar6;
  pointer puVar7;
  size_t i;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_XMM2 [16];
  undefined1 extraout_var [56];
  
  puVar4 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = 0;
  puVar3 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar7 = puVar3; puVar7 != puVar4; puVar7 = puVar7 + 1) {
    iVar5 = iVar5 + *puVar7;
  }
  iVar6 = 0;
  for (puVar7 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 != (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    iVar6 = iVar6 + *puVar7;
  }
  auVar10 = ZEXT1664(ZEXT816(0));
  for (uVar8 = 0; uVar8 < (ulong)((long)puVar4 - (long)puVar3 >> 2); uVar8 = uVar8 + 1) {
    if ((puVar3[uVar8] != 0) &&
       (uVar1 = (Q->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar8], uVar1 != 0)) {
      auVar9 = vcvtusi2sd_avx512f(in_XMM2,puVar3[uVar8]);
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,uVar1);
      auVar11._0_8_ = log2(auVar2._0_8_ / (double)iVar6);
      auVar11._8_56_ = extraout_var;
      puVar3 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (P->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = auVar9._0_8_ / (double)iVar5;
      auVar9 = vfmadd231sd_fma(auVar10._0_16_,auVar11._0_16_,auVar2);
      auVar10 = ZEXT1664(auVar9);
    }
  }
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar9 = vxorpd_avx512vl(auVar10._0_16_,auVar9);
  return auVar9._0_8_;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}